

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

char * libtorrent::name_for_setting(int s)

{
  uint uVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  char *pcStack_10;
  int s_local;
  
  uVar1 = s & 0xc000;
  if (uVar1 == 0) {
    pvVar2 = aux::
             container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
             ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                           *)(anonymous_namespace)::str_settings,(long)s);
    pcStack_10 = pvVar2->name;
  }
  else if (uVar1 == 0x4000) {
    pvVar3 = aux::
             container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
             ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                           *)(anonymous_namespace)::int_settings,(long)(s + -0x4000));
    pcStack_10 = pvVar3->name;
  }
  else if (uVar1 == 0x8000) {
    pvVar4 = aux::
             container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
             ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                           *)(anonymous_namespace)::bool_settings,(long)(s + -0x8000));
    pcStack_10 = pvVar4->name;
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

char const* name_for_setting(int s)
	{
		switch (s & settings_pack::type_mask)
		{
			case settings_pack::string_type_base:
				return str_settings[s - settings_pack::string_type_base].name;
			case settings_pack::int_type_base:
				return int_settings[s - settings_pack::int_type_base].name;
			case settings_pack::bool_type_base:
				return bool_settings[s - settings_pack::bool_type_base].name;
		}
		return "";
	}